

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blt_gtest_smoke.cpp
# Opt level: O1

void __thiscall
blt_gtest_smoke_basic_assert_example_Test::TestBody(blt_gtest_smoke_basic_assert_example_Test *this)

{
  return;
}

Assistant:

TEST(blt_gtest_smoke,basic_assert_example)
{
  EXPECT_TRUE( true );
}